

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qduplicatetracker_p.h
# Opt level: O0

void __thiscall QDuplicateTracker<QString,_32UL>::clear(QDuplicateTracker<QString,_32UL> *this)

{
  long in_RDI;
  memory_resource *__r;
  long in_FS_OFFSET;
  unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
  *in_stack_ffffffffffffff08;
  monotonic_buffer_resource *in_stack_ffffffffffffff10;
  polymorphic_allocator<QString> *this_00;
  polymorphic_allocator<QString> local_a8;
  unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
  local_a0;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_18 = 0;
  std::
  unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
  ::unordered_set((unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
                   *)0x2967ac);
  std::
  unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
  ::operator=((unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
               *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::
  unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
  ::~unordered_set((unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
                    *)0x2967d1);
  __r = (memory_resource *)(in_RDI + 0x600);
  std::pmr::monotonic_buffer_resource::release(in_stack_ffffffffffffff10);
  this_00 = &local_a8;
  std::pmr::polymorphic_allocator<QString>::polymorphic_allocator(this_00,__r);
  std::
  unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
  ::unordered_set(&local_a0,(size_type)this_00,(allocator_type *)__r);
  std::
  unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
  ::operator=((unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
               *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::
  unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
  ::~unordered_set((unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
                    *)0x296836);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clear()
    {
#ifdef __cpp_lib_memory_resource
        // The birth defect of std::unordered_set is that both the nodes as
        // well as the bucket array are allocated from the same allocator, so
        // if we want to reclaim memory from the freed nodes, we also need to
        // reclaim the memory for the bucket array.

        set = Set();    // release all memory in `res` (clear() doesn't, and swap() is UB!)
        res.release();  // restore to initial state (buffer, sizeof buffer)
                        // m_b_r can't reuse buffers, anyway
        // now that `res` is reset to the initial state, also reset `set`:
        set = Set{Prealloc, &res};
#else
        set.clear();
#endif // __cpp_lib_memory_resource
    }